

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O3

void __thiscall QToolButton::paintEvent(QToolButton *this,QPaintEvent *param_1)

{
  long in_FS_OFFSET;
  QStyleOptionToolButton opt;
  undefined1 *local_d8;
  QToolButton *pQStack_d0;
  QStyle *local_c8;
  QStyleOptionToolButton local_b8;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_c8 = (QStyle *)&DAT_aaaaaaaaaaaaaaaa;
  local_d8 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_d0 = (QToolButton *)&DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_d8);
  pQStack_d0 = this;
  local_c8 = QWidget::style((QWidget *)this);
  QPainter::begin((QPaintDevice *)&local_d8);
  QPainter::setRenderHint((RenderHint)&local_d8,true);
  memset(&local_b8,0xaa,0x98);
  QStyleOptionToolButton::QStyleOptionToolButton(&local_b8);
  (**(code **)(*(long *)&(this->super_QAbstractButton).super_QWidget + 0x1b8))(this,&local_b8);
  (**(code **)(*(long *)local_c8 + 200))(local_c8,4,&local_b8,&local_d8,pQStack_d0);
  QFont::~QFont(&local_b8.font);
  if (&(local_b8.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.text.d.d)->super_QArrayData,2,0x10);
    }
  }
  QIcon::~QIcon(&local_b8.icon);
  QStyleOption::~QStyleOption((QStyleOption *)&local_b8);
  QPainter::~QPainter((QPainter *)&local_d8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolButton::paintEvent(QPaintEvent *)
{
    QStylePainter p(this);
    QStyleOptionToolButton opt;
    initStyleOption(&opt);
    p.drawComplexControl(QStyle::CC_ToolButton, opt);
}